

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jasmin.cpp
# Opt level: O2

void __thiscall Oric::Jasmin::set_activity_observer(Jasmin *this,Observer *observer)

{
  Observer *pOVar1;
  allocator<char> local_31;
  string local_30 [32];
  
  this->observer_ = observer;
  if (observer != (Observer *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>(local_30,"Jasmin",&local_31);
    (*observer->_vptr_Observer[2])(observer,local_30,0);
    std::__cxx11::string::~string(local_30);
    pOVar1 = this->observer_;
    std::__cxx11::string::string<std::allocator<char>>(local_30,"Jasmin",&local_31);
    (*pOVar1->_vptr_Observer[4])
              (pOVar1,local_30,(ulong)(byte)(this->super_DiskController).field_0x4e4);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void Jasmin::set_activity_observer(Activity::Observer *observer) {
	observer_ = observer;
	if(observer) {
		observer->register_led("Jasmin");
		observer_->set_led_status("Jasmin", motor_on_);
	}
}